

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeConcepts.hh
# Opt level: O2

void __thiscall avro::concepts::NoAttribute<int>::add(NoAttribute<int> *this,int *attr)

{
  Exception *this_00;
  allocator<char> local_39;
  string local_38;
  
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"This type does not have attribute",&local_39);
  Exception::Exception(this_00,&local_38);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void add( const Attribute &attr) {
        // There must be an add function for the generic NodeImpl, but the
        // Node APIs ensure that it is never called, the throw here is
        // just in case
        throw Exception("This type does not have attribute");
    }